

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT32 __thiscall DROPlayer::GetCurPos(DROPlayer *this,UINT8 unit)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,unit);
  if (iVar1 == 2) {
    return this->_playSmpl;
  }
  if (iVar1 != 1) {
    if (iVar1 == 0) {
      return this->_filePos;
    }
    return 0xffffffff;
  }
  return this->_playTick;
}

Assistant:

UINT32 DROPlayer::GetCurPos(UINT8 unit) const
{
	switch(unit)
	{
	case PLAYPOS_FILEOFS:
		return _filePos;
	case PLAYPOS_TICK:
		return _playTick;
	case PLAYPOS_SAMPLE:
		return _playSmpl;
	case PLAYPOS_COMMAND:
	default:
		return (UINT32)-1;
	}
}